

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_inv(secp256k1_fe *r,secp256k1_fe *a)

{
  int iVar1;
  secp256k1_fe x176;
  secp256k1_fe x6;
  secp256k1_fe x44;
  secp256k1_fe x22;
  secp256k1_fe x3;
  secp256k1_fe x88;
  secp256k1_fe x2;
  secp256k1_fe local_158;
  secp256k1_fe local_128;
  secp256k1_fe local_f8;
  secp256k1_fe local_c8;
  secp256k1_fe local_a0;
  secp256k1_fe local_78;
  secp256k1_fe local_50;
  
  secp256k1_fe_sqr(&local_50,a);
  secp256k1_fe_mul(&local_50,&local_50,a);
  secp256k1_fe_sqr(&local_a0,&local_50);
  secp256k1_fe_mul(&local_a0,&local_a0,a);
  local_128.n[4] = local_a0.n[4];
  local_128.n[2] = local_a0.n[2];
  local_128.n[3] = local_a0.n[3];
  local_128.n[0] = local_a0.n[0];
  local_128.n[1] = local_a0.n[1];
  iVar1 = 3;
  do {
    secp256k1_fe_sqr(&local_128,&local_128);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  secp256k1_fe_mul(&local_128,&local_128,&local_a0);
  iVar1 = 3;
  do {
    secp256k1_fe_sqr(&local_128,&local_128);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  secp256k1_fe_mul(&local_128,&local_128,&local_a0);
  iVar1 = 1;
  do {
    secp256k1_fe_sqr(&local_128,&local_128);
    iVar1 = iVar1 + -1;
  } while (iVar1 == 0);
  secp256k1_fe_mul(&local_128,&local_128,&local_50);
  local_c8.n[4] = local_128.n[4];
  local_c8.n[2] = local_128.n[2];
  local_c8.n[3] = local_128.n[3];
  local_c8.n[0] = local_128.n[0];
  local_c8.n[1] = local_128.n[1];
  iVar1 = 0xb;
  do {
    secp256k1_fe_sqr(&local_c8,&local_c8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  secp256k1_fe_mul(&local_c8,&local_c8,&local_128);
  local_f8.n[4] = local_c8.n[4];
  local_f8.n[2] = local_c8.n[2];
  local_f8.n[3] = local_c8.n[3];
  local_f8.n[0] = local_c8.n[0];
  local_f8.n[1] = local_c8.n[1];
  iVar1 = 0x16;
  do {
    secp256k1_fe_sqr(&local_f8,&local_f8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  secp256k1_fe_mul(&local_f8,&local_f8,&local_c8);
  local_78.n[4] = local_f8.n[4];
  local_78.n[2] = local_f8.n[2];
  local_78.n[3] = local_f8.n[3];
  local_78.n[0] = local_f8.n[0];
  local_78.n[1] = local_f8.n[1];
  iVar1 = 0x2c;
  do {
    secp256k1_fe_sqr(&local_78,&local_78);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  secp256k1_fe_mul(&local_78,&local_78,&local_f8);
  local_158.n[4] = local_78.n[4];
  local_158.n[2] = local_78.n[2];
  local_158.n[3] = local_78.n[3];
  local_158.n[0] = local_78.n[0];
  local_158.n[1] = local_78.n[1];
  iVar1 = 0x58;
  do {
    secp256k1_fe_sqr(&local_158,&local_158);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  secp256k1_fe_mul(&local_158,&local_158,&local_78);
  iVar1 = 0x2c;
  do {
    secp256k1_fe_sqr(&local_158,&local_158);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  secp256k1_fe_mul(&local_158,&local_158,&local_f8);
  iVar1 = 3;
  do {
    secp256k1_fe_sqr(&local_158,&local_158);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  secp256k1_fe_mul(&local_158,&local_158,&local_a0);
  iVar1 = 0x17;
  do {
    secp256k1_fe_sqr(&local_158,&local_158);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  secp256k1_fe_mul(&local_158,&local_158,&local_c8);
  iVar1 = 5;
  do {
    secp256k1_fe_sqr(&local_158,&local_158);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  secp256k1_fe_mul(&local_158,&local_158,a);
  iVar1 = 3;
  do {
    secp256k1_fe_sqr(&local_158,&local_158);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  secp256k1_fe_mul(&local_158,&local_158,&local_50);
  iVar1 = 1;
  do {
    secp256k1_fe_sqr(&local_158,&local_158);
    iVar1 = iVar1 + -1;
  } while (iVar1 == 0);
  secp256k1_fe_mul(r,a,&local_158);
  return;
}

Assistant:

static void secp256k1_fe_inv(secp256k1_fe *r, const secp256k1_fe *a) {
    secp256k1_fe x2, x3, x6, x9, x11, x22, x44, x88, x176, x220, x223, t1;
    int j;

    /** The binary representation of (p - 2) has 5 blocks of 1s, with lengths in
     *  { 1, 2, 22, 223 }. Use an addition chain to calculate 2^n - 1 for each block:
     *  [1], [2], 3, 6, 9, 11, [22], 44, 88, 176, 220, [223]
     */

    secp256k1_fe_sqr(&x2, a);
    secp256k1_fe_mul(&x2, &x2, a);

    secp256k1_fe_sqr(&x3, &x2);
    secp256k1_fe_mul(&x3, &x3, a);

    x6 = x3;
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&x6, &x6);
    }
    secp256k1_fe_mul(&x6, &x6, &x3);

    x9 = x6;
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&x9, &x9);
    }
    secp256k1_fe_mul(&x9, &x9, &x3);

    x11 = x9;
    for (j=0; j<2; j++) {
        secp256k1_fe_sqr(&x11, &x11);
    }
    secp256k1_fe_mul(&x11, &x11, &x2);

    x22 = x11;
    for (j=0; j<11; j++) {
        secp256k1_fe_sqr(&x22, &x22);
    }
    secp256k1_fe_mul(&x22, &x22, &x11);

    x44 = x22;
    for (j=0; j<22; j++) {
        secp256k1_fe_sqr(&x44, &x44);
    }
    secp256k1_fe_mul(&x44, &x44, &x22);

    x88 = x44;
    for (j=0; j<44; j++) {
        secp256k1_fe_sqr(&x88, &x88);
    }
    secp256k1_fe_mul(&x88, &x88, &x44);

    x176 = x88;
    for (j=0; j<88; j++) {
        secp256k1_fe_sqr(&x176, &x176);
    }
    secp256k1_fe_mul(&x176, &x176, &x88);

    x220 = x176;
    for (j=0; j<44; j++) {
        secp256k1_fe_sqr(&x220, &x220);
    }
    secp256k1_fe_mul(&x220, &x220, &x44);

    x223 = x220;
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&x223, &x223);
    }
    secp256k1_fe_mul(&x223, &x223, &x3);

    /* The final result is then assembled using a sliding window over the blocks. */

    t1 = x223;
    for (j=0; j<23; j++) {
        secp256k1_fe_sqr(&t1, &t1);
    }
    secp256k1_fe_mul(&t1, &t1, &x22);
    for (j=0; j<5; j++) {
        secp256k1_fe_sqr(&t1, &t1);
    }
    secp256k1_fe_mul(&t1, &t1, a);
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&t1, &t1);
    }
    secp256k1_fe_mul(&t1, &t1, &x2);
    for (j=0; j<2; j++) {
        secp256k1_fe_sqr(&t1, &t1);
    }
    secp256k1_fe_mul(r, a, &t1);
}